

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmuStructs.h
# Opt level: O0

void INIT_DEVINF(DEV_INFO *devInf,DEV_DATA *devData,UINT32 sampleRate,DEV_DEF *devDef)

{
  DEV_DEF *devDef_local;
  UINT32 sampleRate_local;
  DEV_DATA *devData_local;
  DEV_INFO *devInf_local;
  
  devInf->dataPtr = devData;
  devInf->sampleRate = sampleRate;
  devInf->devDef = devDef;
  devInf->linkDevCount = 0;
  devInf->linkDevs = (DEVLINK_INFO *)0x0;
  return;
}

Assistant:

INLINE void INIT_DEVINF(DEV_INFO* devInf, DEV_DATA* devData, UINT32 sampleRate, const DEV_DEF* devDef)
{
	devInf->dataPtr = devData;
	devInf->sampleRate = sampleRate;
	devInf->devDef = devDef;
	
	devInf->linkDevCount = 0;
	devInf->linkDevs = NULL;
	return;
}